

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

Node<GoState<3U,_3U>_> * __thiscall
MCTS::Node<GoState<3U,_3U>_>::select_child_UCT(Node<GoState<3U,_3U>_> *this)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  reference ppNVar4;
  __normal_iterator<MCTS::Node<GoState<3U,_3U>_>_*const_*,_std::vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>_>
  *in_RDI;
  double dVar5;
  Node<GoState<3U,_3U>_> *child;
  const_iterator __end0;
  const_iterator __begin0;
  vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_> *__range2;
  int in_stack_00000204;
  char *in_stack_00000208;
  char *in_stack_00000210;
  vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>
  *in_stack_ffffffffffffffa8;
  vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<MCTS::Node<GoState<3U,_3U>_>_*const_*,_std::vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>_>
  local_30;
  Node<GoState<3U,_3U>_> *local_28;
  Node<GoState<3U,_3U>_> **local_20;
  __normal_iterator<MCTS::Node<GoState<3U,_3U>_>_*const_*,_std::vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>_>
  local_18;
  __normal_iterator<MCTS::Node<GoState<3U,_3U>_>_*const_*,_std::vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>_>
  *local_10;
  
  bVar1 = std::
          vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>::
          empty(in_stack_ffffffffffffffc0);
  if (bVar1) {
    assertion_failed(in_stack_00000210,in_stack_00000208,in_stack_00000204);
  }
  local_10 = in_RDI + 8;
  local_18._M_current =
       (Node<GoState<3U,_3U>_> **)
       std::vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_20 = (Node<GoState<3U,_3U>_> **)
             std::
             vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>
             ::end(in_stack_ffffffffffffffa8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_RDI,(__normal_iterator<MCTS::Node<GoState<3U,_3U>_>_*const_*,_std::vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>_>
                                    *)in_stack_ffffffffffffffa8), bVar1) {
    ppNVar4 = __gnu_cxx::
              __normal_iterator<MCTS::Node<GoState<3U,_3U>_>_*const_*,_std::vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>_>
              ::operator*(&local_18);
    local_28 = *ppNVar4;
    in_stack_ffffffffffffffa8 =
         (vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_> *)
         (local_28->wins / (double)local_28->visits);
    dVar5 = log((double)*(int *)&in_RDI[4]._M_current);
    dVar5 = sqrt((dVar5 * 2.0) / (double)local_28->visits);
    local_28->UCT_score = (double)in_stack_ffffffffffffffa8 + dVar5;
    __gnu_cxx::
    __normal_iterator<MCTS::Node<GoState<3U,_3U>_>_*const_*,_std::vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>_>
    ::operator++(&local_18);
  }
  cVar2 = std::
          vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>::
          begin(in_stack_ffffffffffffffa8);
  cVar3 = std::
          vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>::
          end(in_stack_ffffffffffffffa8);
  local_30 = std::
             max_element<__gnu_cxx::__normal_iterator<MCTS::Node<GoState<3u,3u>>*const*,std::vector<MCTS::Node<GoState<3u,3u>>*,std::allocator<MCTS::Node<GoState<3u,3u>>*>>>,MCTS::Node<GoState<3u,3u>>::select_child_UCT()const::_lambda(MCTS::Node<GoState<3u,3u>>*,MCTS::Node<GoState<3u,3u>>*)_1_>
                       (cVar2._M_current,cVar3._M_current);
  ppNVar4 = __gnu_cxx::
            __normal_iterator<MCTS::Node<GoState<3U,_3U>_>_*const_*,_std::vector<MCTS::Node<GoState<3U,_3U>_>_*,_std::allocator<MCTS::Node<GoState<3U,_3U>_>_*>_>_>
            ::operator*(&local_30);
  return *ppNVar4;
}

Assistant:

Node<State>* Node<State>::select_child_UCT() const
{
	attest( ! children.empty() );
	for (auto child: children) {
		child->UCT_score = double(child->wins) / double(child->visits) +
			std::sqrt(2.0 * std::log(double(this->visits)) / child->visits);
	}

	return *std::max_element(children.begin(), children.end(),
		[](Node* a, Node* b) { return a->UCT_score < b->UCT_score; });
}